

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void ImGui::SFML::Shutdown(void)

{
  unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
  *puVar1;
  allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>
  *extraout_RDX;
  
  (anonymous_namespace)::s_currWindowCtx = 0;
  SetCurrentContext((ImGuiContext *)0x0);
  puVar1 = (anonymous_namespace)::s_windowContexts;
  if (DAT_0021b150 != (anonymous_namespace)::s_windowContexts) {
    std::
    _Destroy<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>*,std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>>
              ((anonymous_namespace)::s_windowContexts,DAT_0021b150,extraout_RDX);
    DAT_0021b150 = puVar1;
  }
  return;
}

Assistant:

void Shutdown() {
    s_currWindowCtx = nullptr;
    ImGui::SetCurrentContext(nullptr);

    s_windowContexts.clear();
}